

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

ostream * pstd::operator<<(ostream *os,optional<float> *opt)

{
  bool bVar1;
  ostream *poVar2;
  float *pfVar3;
  char *pcVar4;
  
  bVar1 = opt->set;
  poVar2 = std::operator<<(os,"[ pstd::optional<");
  poVar2 = std::operator<<(poVar2,_pthread_mutex_init + (*_pthread_mutex_init == '*'));
  if (bVar1 == true) {
    poVar2 = std::operator<<(poVar2,"> set: true ");
    poVar2 = std::operator<<(poVar2,"value: ");
    pfVar3 = optional<float>::value(opt);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pfVar3);
    pcVar4 = " ]";
  }
  else {
    pcVar4 = "> set: false value: n/a ]";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}